

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hpp
# Opt level: O2

string * pstore::path::posix::join(string *__return_storage_ptr__,string *path,string *b)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  std::__cxx11::string::string((string *)&bStack_48,(string *)b);
  local_28._M_len = 1;
  local_28._M_array = &bStack_48;
  join(__return_storage_ptr__,path,&local_28);
  std::__cxx11::string::~string((string *)&bStack_48);
  return __return_storage_ptr__;
}

Assistant:

inline std::string join (std::string const & path, std::string const & b) {
                return join (path, {b});
            }